

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

char * __thiscall phosg::dirname(phosg *this,char *__path)

{
  size_type __n;
  allocator<char> local_11;
  
  __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__path,'/',
                   0xffffffffffffffff);
  if (__n == 0xffffffffffffffff) {
    ::std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_11);
  }
  else {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__path,0,__n);
  }
  return (char *)this;
}

Assistant:

std::string dirname(const std::string& filename) {
  size_t slash_pos = filename.rfind('/');
  return (slash_pos == string::npos) ? "" : filename.substr(0, slash_pos);
}